

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O0

void __thiscall diff_match_patch_test::testDiffMain(diff_match_patch_test *this)

{
  allocator<wchar_t> local_3b29;
  wstring local_3b28;
  deque<Diff,_std::allocator<Diff>_> local_3b08;
  undefined1 local_3ab8 [8];
  deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  texts_textmode;
  undefined1 local_3a18 [8];
  deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  texts_linemode;
  deque<Diff,_std::allocator<Diff>_> local_3978;
  allocator<wchar_t> local_3921;
  wstring local_3920;
  deque<Diff,_std::allocator<Diff>_> local_3900;
  deque<Diff,_std::allocator<Diff>_> local_38b0;
  allocator<wchar_t> local_3859;
  wstring local_3858;
  allocator<wchar_t> local_3831;
  wstring local_3830;
  allocator<wchar_t> local_3809;
  wstring local_3808;
  clock_t local_37e8;
  clock_t endTime;
  clock_t local_3790;
  clock_t startTime;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_3768;
  int local_3748;
  allocator<wchar_t> local_3741;
  int x;
  wstring b;
  undefined1 local_3718 [8];
  wstring a;
  wstring local_36f0 [39];
  allocator<wchar_t> local_36c9;
  wstring local_36c8 [32];
  deque<Diff,_std::allocator<Diff>_> local_36a8;
  allocator<wchar_t> local_3651;
  wstring local_3650;
  allocator<wchar_t> local_3629;
  wstring local_3628 [32];
  Diff local_3608;
  allocator<wchar_t> local_35d9;
  wstring local_35d8 [32];
  Diff local_35b8;
  allocator<wchar_t> local_3589;
  wstring local_3588 [32];
  Diff local_3568;
  allocator<wchar_t> local_3539;
  wstring local_3538 [32];
  Diff local_3518;
  allocator<wchar_t> local_34e9;
  wstring local_34e8 [32];
  Diff local_34c8;
  allocator<wchar_t> local_3499;
  wstring local_3498 [32];
  Diff local_3478;
  allocator<wchar_t> local_3449;
  wstring local_3448 [32];
  Diff local_3428;
  allocator<wchar_t> local_33f9;
  wstring local_33f8 [32];
  Diff local_33d8;
  allocator<wchar_t> local_33a9;
  wstring local_33a8 [32];
  Diff local_3388;
  allocator<wchar_t> local_3359;
  wstring local_3358 [32];
  Diff local_3338;
  deque<Diff,_std::allocator<Diff>_> local_3310;
  allocator<wchar_t> local_32b9;
  wstring local_32b8 [39];
  allocator<wchar_t> local_3291;
  wstring local_3290 [32];
  deque<Diff,_std::allocator<Diff>_> local_3270;
  allocator<wchar_t> local_3219;
  wstring local_3218;
  allocator<wchar_t> local_31f1;
  wstring local_31f0 [32];
  Diff local_31d0;
  allocator<wchar_t> local_31a1;
  wstring local_31a0 [32];
  Diff local_3180;
  allocator<wchar_t> local_3151;
  wstring local_3150 [32];
  Diff local_3130;
  allocator<wchar_t> local_3101;
  wstring local_3100 [32];
  Diff local_30e0;
  allocator<wchar_t> local_30b1;
  wstring local_30b0 [32];
  Diff local_3090;
  allocator<wchar_t> local_3061;
  wstring local_3060 [32];
  Diff local_3040;
  allocator<wchar_t> local_3011;
  wstring local_3010 [32];
  Diff local_2ff0;
  allocator<wchar_t> local_2fc1;
  wstring local_2fc0 [32];
  Diff local_2fa0;
  allocator<wchar_t> local_2f71;
  wstring local_2f70 [32];
  Diff local_2f50;
  allocator<wchar_t> local_2f21;
  wstring local_2f20 [32];
  Diff local_2f00;
  deque<Diff,_std::allocator<Diff>_> local_2ed8;
  allocator<wchar_t> local_2e81;
  wstring local_2e80 [39];
  allocator<wchar_t> local_2e59;
  wstring local_2e58 [32];
  deque<Diff,_std::allocator<Diff>_> local_2e38;
  allocator<wchar_t> local_2de1;
  wstring local_2de0;
  allocator<wchar_t> local_2db9;
  wstring local_2db8 [32];
  Diff local_2d98;
  allocator<wchar_t> local_2d69;
  wstring local_2d68 [32];
  Diff local_2d48;
  allocator<wchar_t> local_2d19;
  wstring local_2d18 [32];
  Diff local_2cf8;
  allocator<wchar_t> local_2cc9;
  wstring local_2cc8 [32];
  Diff local_2ca8;
  allocator<wchar_t> local_2c79;
  wstring local_2c78 [32];
  Diff local_2c58;
  allocator<wchar_t> local_2c29;
  wstring local_2c28 [32];
  Diff local_2c08;
  allocator<wchar_t> local_2bd9;
  wstring local_2bd8 [32];
  Diff local_2bb8;
  allocator<wchar_t> local_2b89;
  wstring local_2b88 [32];
  Diff local_2b68;
  allocator<wchar_t> local_2b39;
  wstring local_2b38 [32];
  Diff local_2b18;
  allocator<wchar_t> local_2ae9;
  wstring local_2ae8 [32];
  Diff local_2ac8;
  deque<Diff,_std::allocator<Diff>_> local_2aa0;
  allocator<wchar_t> local_2a49;
  wstring local_2a48 [39];
  allocator<wchar_t> local_2a21;
  wstring local_2a20 [32];
  deque<Diff,_std::allocator<Diff>_> local_2a00;
  allocator<wchar_t> local_29a9;
  wstring local_29a8;
  allocator<wchar_t> local_2981;
  wstring local_2980 [32];
  Diff local_2960;
  allocator<wchar_t> local_2931;
  wstring local_2930 [32];
  Diff local_2910;
  allocator<wchar_t> local_28e1;
  wstring local_28e0 [32];
  Diff local_28c0;
  allocator<wchar_t> local_2891;
  wstring local_2890 [32];
  Diff local_2870;
  allocator<wchar_t> local_2841;
  wstring local_2840 [32];
  Diff local_2820;
  allocator<wchar_t> local_27f1;
  wstring local_27f0 [32];
  Diff local_27d0;
  allocator<wchar_t> local_27a1;
  wstring local_27a0 [32];
  Diff local_2780;
  allocator<wchar_t> local_2751;
  wstring local_2750 [32];
  Diff local_2730;
  allocator<wchar_t> local_2701;
  wstring local_2700 [32];
  Diff local_26e0;
  allocator<wchar_t> local_26b1;
  wstring local_26b0 [32];
  Diff local_2690;
  deque<Diff,_std::allocator<Diff>_> local_2668;
  allocator local_2611;
  wstring local_2610 [39];
  allocator<wchar_t> local_25e9;
  wstring local_25e8 [32];
  deque<Diff,_std::allocator<Diff>_> local_25c8;
  allocator<wchar_t> local_2571;
  wstring local_2570;
  allocator<wchar_t> local_2549;
  wstring local_2548 [32];
  Diff local_2528;
  allocator<wchar_t> local_24f9;
  wstring local_24f8 [32];
  Diff local_24d8;
  allocator<wchar_t> local_24a9;
  wstring local_24a8 [32];
  Diff local_2488;
  allocator<wchar_t> local_2459;
  wstring local_2458 [32];
  Diff local_2438;
  allocator<wchar_t> local_2409;
  wstring local_2408 [32];
  Diff local_23e8;
  allocator local_23b9;
  wstring local_23b8 [32];
  Diff local_2398;
  allocator<wchar_t> local_2369;
  wstring local_2368 [32];
  Diff local_2348;
  allocator<wchar_t> local_2319;
  wstring local_2318 [32];
  Diff local_22f8;
  allocator local_22c9;
  wstring local_22c8 [32];
  Diff local_22a8;
  allocator<wchar_t> local_2279;
  wstring local_2278 [32];
  Diff local_2258;
  deque<Diff,_std::allocator<Diff>_> local_2230;
  allocator<wchar_t> local_21d9;
  wstring local_21d8 [39];
  allocator<wchar_t> local_21b1;
  wstring local_21b0 [32];
  deque<Diff,_std::allocator<Diff>_> local_2190;
  allocator<wchar_t> local_2139;
  wstring local_2138;
  allocator<wchar_t> local_2111;
  wstring local_2110 [32];
  Diff local_20f0;
  allocator<wchar_t> local_20c1;
  wstring local_20c0 [32];
  Diff local_20a0;
  allocator<wchar_t> local_2071;
  wstring local_2070 [32];
  Diff local_2050;
  allocator<wchar_t> local_2021;
  wstring local_2020 [32];
  Diff local_2000;
  allocator<wchar_t> local_1fd1;
  wstring local_1fd0 [32];
  Diff local_1fb0;
  allocator<wchar_t> local_1f81;
  wstring local_1f80 [32];
  Diff local_1f60;
  allocator<wchar_t> local_1f31;
  wstring local_1f30 [32];
  Diff local_1f10;
  allocator<wchar_t> local_1ee1;
  wstring local_1ee0 [32];
  Diff local_1ec0;
  allocator<wchar_t> local_1e91;
  wstring local_1e90 [32];
  Diff local_1e70;
  allocator<wchar_t> local_1e41;
  wstring local_1e40 [32];
  Diff local_1e20;
  deque<Diff,_std::allocator<Diff>_> local_1df8;
  allocator<wchar_t> local_1da1;
  wstring local_1da0 [39];
  allocator<wchar_t> local_1d79;
  wstring local_1d78 [32];
  deque<Diff,_std::allocator<Diff>_> local_1d58;
  allocator<wchar_t> local_1d01;
  wstring local_1d00;
  allocator<wchar_t> local_1cd9;
  wstring local_1cd8 [32];
  Diff local_1cb8;
  allocator<wchar_t> local_1c89;
  wstring local_1c88 [32];
  Diff local_1c68;
  allocator<wchar_t> local_1c39;
  wstring local_1c38 [32];
  Diff local_1c18;
  allocator<wchar_t> local_1be9;
  wstring local_1be8 [32];
  Diff local_1bc8;
  allocator<wchar_t> local_1b99;
  wstring local_1b98 [32];
  Diff local_1b78;
  allocator<wchar_t> local_1b49;
  wstring local_1b48 [32];
  Diff local_1b28;
  allocator<wchar_t> local_1af9;
  wstring local_1af8 [32];
  Diff local_1ad8;
  allocator<wchar_t> local_1aa9;
  wstring local_1aa8 [32];
  Diff local_1a88;
  allocator<wchar_t> local_1a59;
  wstring local_1a58 [32];
  Diff local_1a38;
  allocator<wchar_t> local_1a09;
  wstring local_1a08 [32];
  Diff local_19e8;
  deque<Diff,_std::allocator<Diff>_> local_19c0;
  allocator<wchar_t> local_1969;
  wstring local_1968 [39];
  allocator<wchar_t> local_1941;
  wstring local_1940 [32];
  deque<Diff,_std::allocator<Diff>_> local_1920;
  allocator<wchar_t> local_18c9;
  wstring local_18c8;
  allocator<wchar_t> local_18a1;
  wstring local_18a0 [32];
  Diff local_1880;
  allocator<wchar_t> local_1851;
  wstring local_1850 [32];
  Diff local_1830;
  allocator<wchar_t> local_1801;
  wstring local_1800 [32];
  Diff local_17e0;
  allocator<wchar_t> local_17b1;
  wstring local_17b0 [32];
  Diff local_1790;
  allocator<wchar_t> local_1761;
  wstring local_1760 [32];
  Diff local_1740;
  allocator<wchar_t> local_1711;
  wstring local_1710 [32];
  Diff local_16f0;
  allocator<wchar_t> local_16c1;
  wstring local_16c0 [32];
  Diff local_16a0;
  allocator<wchar_t> local_1671;
  wstring local_1670 [32];
  Diff local_1650;
  allocator<wchar_t> local_1621;
  wstring local_1620 [32];
  Diff local_1600;
  allocator<wchar_t> local_15d1;
  wstring local_15d0 [32];
  Diff local_15b0;
  deque<Diff,_std::allocator<Diff>_> local_1588;
  allocator<wchar_t> local_1531;
  wstring local_1530 [39];
  allocator<wchar_t> local_1509;
  wstring local_1508 [32];
  deque<Diff,_std::allocator<Diff>_> local_14e8;
  allocator<wchar_t> local_1491;
  wstring local_1490;
  allocator<wchar_t> local_1469;
  wstring local_1468 [32];
  Diff local_1448;
  allocator<wchar_t> local_1419;
  wstring local_1418 [32];
  Diff local_13f8;
  allocator<wchar_t> local_13c9;
  wstring local_13c8 [32];
  Diff local_13a8;
  allocator<wchar_t> local_1379;
  wstring local_1378 [32];
  Diff local_1358;
  allocator<wchar_t> local_1329;
  wstring local_1328 [32];
  Diff local_1308;
  allocator<wchar_t> local_12d9;
  wstring local_12d8 [32];
  Diff local_12b8;
  allocator<wchar_t> local_1289;
  wstring local_1288 [32];
  Diff local_1268;
  allocator<wchar_t> local_1239;
  wstring local_1238 [32];
  Diff local_1218;
  allocator<wchar_t> local_11e9;
  wstring local_11e8 [32];
  Diff local_11c8;
  allocator<wchar_t> local_1199;
  wstring local_1198 [32];
  Diff local_1178;
  deque<Diff,_std::allocator<Diff>_> local_1150;
  allocator<wchar_t> local_10f9;
  wstring local_10f8 [39];
  allocator<wchar_t> local_10d1;
  wstring local_10d0 [32];
  deque<Diff,_std::allocator<Diff>_> local_10b0;
  allocator<wchar_t> local_1059;
  wstring local_1058;
  allocator<wchar_t> local_1031;
  wstring local_1030 [32];
  Diff local_1010;
  allocator<wchar_t> local_fe1;
  wstring local_fe0 [32];
  Diff local_fc0;
  allocator<wchar_t> local_f91;
  wstring local_f90 [32];
  Diff local_f70;
  allocator<wchar_t> local_f41;
  wstring local_f40 [32];
  Diff local_f20;
  allocator<wchar_t> local_ef1;
  wstring local_ef0 [32];
  Diff local_ed0;
  allocator<wchar_t> local_ea1;
  wstring local_ea0 [32];
  Diff local_e80;
  allocator<wchar_t> local_e51;
  wstring local_e50 [32];
  Diff local_e30;
  allocator<wchar_t> local_e01;
  wstring local_e00 [32];
  Diff local_de0;
  allocator<wchar_t> local_db1;
  wstring local_db0 [32];
  Diff local_d90;
  allocator<wchar_t> local_d61;
  wstring local_d60 [32];
  Diff local_d40;
  deque<Diff,_std::allocator<Diff>_> local_d18;
  allocator<wchar_t> local_cc1;
  wstring local_cc0 [39];
  allocator<wchar_t> local_c99;
  wstring local_c98 [32];
  deque<Diff,_std::allocator<Diff>_> local_c78;
  allocator<wchar_t> local_c21;
  wstring local_c20;
  allocator<wchar_t> local_bf9;
  wstring local_bf8 [32];
  Diff local_bd8;
  allocator<wchar_t> local_ba9;
  wstring local_ba8 [32];
  Diff local_b88;
  allocator<wchar_t> local_b59;
  wstring local_b58 [32];
  Diff local_b38;
  allocator<wchar_t> local_b09;
  wstring local_b08 [32];
  Diff local_ae8;
  allocator<wchar_t> local_ab9;
  wstring local_ab8 [32];
  Diff local_a98;
  allocator<wchar_t> local_a69;
  wstring local_a68 [32];
  Diff local_a48;
  allocator<wchar_t> local_a19;
  wstring local_a18 [32];
  Diff local_9f8;
  allocator<wchar_t> local_9c9;
  wstring local_9c8 [32];
  Diff local_9a8;
  allocator<wchar_t> local_979;
  wstring local_978 [32];
  Diff local_958;
  allocator<wchar_t> local_929;
  wstring local_928 [32];
  Diff local_908;
  deque<Diff,_std::allocator<Diff>_> local_8e0;
  allocator<wchar_t> local_889;
  wstring local_888 [39];
  allocator<wchar_t> local_861;
  wstring local_860 [32];
  deque<Diff,_std::allocator<Diff>_> local_840;
  allocator<wchar_t> local_7e9;
  wstring local_7e8;
  allocator<wchar_t> local_7c1;
  wstring local_7c0 [32];
  Diff local_7a0;
  allocator<wchar_t> local_771;
  wstring local_770 [32];
  Diff local_750;
  allocator<wchar_t> local_721;
  wstring local_720 [32];
  Diff local_700;
  allocator<wchar_t> local_6d1;
  wstring local_6d0 [32];
  Diff local_6b0;
  allocator<wchar_t> local_681;
  wstring local_680 [32];
  Diff local_660;
  allocator<wchar_t> local_631;
  wstring local_630 [32];
  Diff local_610;
  allocator<wchar_t> local_5e1;
  wstring local_5e0 [32];
  Diff local_5c0;
  allocator<wchar_t> local_591;
  wstring local_590 [32];
  Diff local_570;
  allocator<wchar_t> local_541;
  wstring local_540 [32];
  Diff local_520;
  allocator<wchar_t> local_4f1;
  wstring local_4f0 [32];
  Diff local_4d0;
  deque<Diff,_std::allocator<Diff>_> local_4a8;
  allocator<wchar_t> local_451;
  wstring local_450 [39];
  allocator<wchar_t> local_429;
  wstring local_428 [32];
  deque<Diff,_std::allocator<Diff>_> local_408;
  allocator<wchar_t> local_3b1;
  wstring local_3b0;
  allocator<wchar_t> local_389;
  wstring local_388 [32];
  Diff local_368;
  allocator<wchar_t> local_339;
  wstring local_338 [32];
  Diff local_318;
  allocator<wchar_t> local_2e9;
  wstring local_2e8 [32];
  Diff local_2c8;
  allocator<wchar_t> local_299;
  wstring local_298 [32];
  Diff local_278;
  allocator<wchar_t> local_249;
  wstring local_248 [32];
  Diff local_228;
  allocator<wchar_t> local_1f9;
  wstring local_1f8 [32];
  Diff local_1d8;
  allocator<wchar_t> local_1a9;
  wstring local_1a8 [32];
  Diff local_188;
  allocator<wchar_t> local_159;
  wstring local_158 [32];
  Diff local_138;
  allocator<wchar_t> local_109;
  wstring local_108 [32];
  Diff local_e8;
  allocator<wchar_t> local_a9;
  wstring local_a8 [32];
  Diff local_88;
  undefined1 local_60 [8];
  deque<Diff,_std::allocator<Diff>_> diffs;
  diff_match_patch_test *this_local;
  
  diffs.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node = (_Map_pointer)this;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_a8,L"",&local_a9);
  Diff::Diff(&local_88,Insert,local_a8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_108,L"",&local_109);
  Diff::Diff(&local_e8,Insert,local_108);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_158,L"",&local_159);
  Diff::Diff(&local_138,Insert,local_158);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1a8,L"",&local_1a9);
  Diff::Diff(&local_188,Insert,local_1a8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1f8,L"",&local_1f9);
  Diff::Diff(&local_1d8,Insert,local_1f8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_248,L"",&local_249);
  Diff::Diff(&local_228,Insert,local_248);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_298,L"",&local_299);
  Diff::Diff(&local_278,Insert,local_298);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2e8,L"",&local_2e9);
  Diff::Diff(&local_2c8,Insert,local_2e8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_338,L"",&local_339);
  Diff::Diff(&local_318,Insert,local_338);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_388,L"",&local_389);
  Diff::Diff(&local_368,Insert,local_388);
  diffList((deque<Diff,_std::allocator<Diff>_> *)local_60,this,&local_88,&local_e8,&local_138,
           &local_188,&local_1d8,&local_228,&local_278,&local_2c8,&local_318,&local_368);
  Diff::~Diff(&local_368);
  std::__cxx11::wstring::~wstring(local_388);
  std::allocator<wchar_t>::~allocator(&local_389);
  Diff::~Diff(&local_318);
  std::__cxx11::wstring::~wstring(local_338);
  std::allocator<wchar_t>::~allocator(&local_339);
  Diff::~Diff(&local_2c8);
  std::__cxx11::wstring::~wstring(local_2e8);
  std::allocator<wchar_t>::~allocator(&local_2e9);
  Diff::~Diff(&local_278);
  std::__cxx11::wstring::~wstring(local_298);
  std::allocator<wchar_t>::~allocator(&local_299);
  Diff::~Diff(&local_228);
  std::__cxx11::wstring::~wstring(local_248);
  std::allocator<wchar_t>::~allocator(&local_249);
  Diff::~Diff(&local_1d8);
  std::__cxx11::wstring::~wstring(local_1f8);
  std::allocator<wchar_t>::~allocator(&local_1f9);
  Diff::~Diff(&local_188);
  std::__cxx11::wstring::~wstring(local_1a8);
  std::allocator<wchar_t>::~allocator(&local_1a9);
  Diff::~Diff(&local_138);
  std::__cxx11::wstring::~wstring(local_158);
  std::allocator<wchar_t>::~allocator(&local_159);
  Diff::~Diff(&local_e8);
  std::__cxx11::wstring::~wstring(local_108);
  std::allocator<wchar_t>::~allocator(&local_109);
  Diff::~Diff(&local_88);
  std::__cxx11::wstring::~wstring(local_a8);
  std::allocator<wchar_t>::~allocator(&local_a9);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_3b0,L"diff_main: Null case.",&local_3b1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_428,L"",&local_429);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_450,L"",&local_451);
  diff_match_patch::diff_main((wstring *)&local_408,(wstring *)this,SUB81(local_428,0));
  assertEquals(this,&local_3b0,(deque<Diff,_std::allocator<Diff>_> *)local_60,&local_408);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_408);
  std::__cxx11::wstring::~wstring(local_450);
  std::allocator<wchar_t>::~allocator(&local_451);
  std::__cxx11::wstring::~wstring(local_428);
  std::allocator<wchar_t>::~allocator(&local_429);
  std::__cxx11::wstring::~wstring((wstring *)&local_3b0);
  std::allocator<wchar_t>::~allocator(&local_3b1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_4f0,L"abc",&local_4f1);
  Diff::Diff(&local_4d0,Equal,local_4f0);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_540,L"",&local_541);
  Diff::Diff(&local_520,Insert,local_540);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_590,L"",&local_591);
  Diff::Diff(&local_570,Insert,local_590);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_5e0,L"",&local_5e1);
  Diff::Diff(&local_5c0,Insert,local_5e0);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_630,L"",&local_631);
  Diff::Diff(&local_610,Insert,local_630);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_680,L"",&local_681);
  Diff::Diff(&local_660,Insert,local_680);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_6d0,L"",&local_6d1);
  Diff::Diff(&local_6b0,Insert,local_6d0);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_720,L"",&local_721);
  Diff::Diff(&local_700,Insert,local_720);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_770,L"",&local_771);
  Diff::Diff(&local_750,Insert,local_770);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_7c0,L"",&local_7c1);
  Diff::Diff(&local_7a0,Insert,local_7c0);
  diffList(&local_4a8,this,&local_4d0,&local_520,&local_570,&local_5c0,&local_610,&local_660,
           &local_6b0,&local_700,&local_750,&local_7a0);
  std::deque<Diff,_std::allocator<Diff>_>::operator=
            ((deque<Diff,_std::allocator<Diff>_> *)local_60,&local_4a8);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_4a8);
  Diff::~Diff(&local_7a0);
  std::__cxx11::wstring::~wstring(local_7c0);
  std::allocator<wchar_t>::~allocator(&local_7c1);
  Diff::~Diff(&local_750);
  std::__cxx11::wstring::~wstring(local_770);
  std::allocator<wchar_t>::~allocator(&local_771);
  Diff::~Diff(&local_700);
  std::__cxx11::wstring::~wstring(local_720);
  std::allocator<wchar_t>::~allocator(&local_721);
  Diff::~Diff(&local_6b0);
  std::__cxx11::wstring::~wstring(local_6d0);
  std::allocator<wchar_t>::~allocator(&local_6d1);
  Diff::~Diff(&local_660);
  std::__cxx11::wstring::~wstring(local_680);
  std::allocator<wchar_t>::~allocator(&local_681);
  Diff::~Diff(&local_610);
  std::__cxx11::wstring::~wstring(local_630);
  std::allocator<wchar_t>::~allocator(&local_631);
  Diff::~Diff(&local_5c0);
  std::__cxx11::wstring::~wstring(local_5e0);
  std::allocator<wchar_t>::~allocator(&local_5e1);
  Diff::~Diff(&local_570);
  std::__cxx11::wstring::~wstring(local_590);
  std::allocator<wchar_t>::~allocator(&local_591);
  Diff::~Diff(&local_520);
  std::__cxx11::wstring::~wstring(local_540);
  std::allocator<wchar_t>::~allocator(&local_541);
  Diff::~Diff(&local_4d0);
  std::__cxx11::wstring::~wstring(local_4f0);
  std::allocator<wchar_t>::~allocator(&local_4f1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_7e8,L"diff_main: Equality.",&local_7e9);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_860,L"abc",&local_861);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_888,L"abc",&local_889);
  diff_match_patch::diff_main((wstring *)&local_840,(wstring *)this,SUB81(local_860,0));
  assertEquals(this,&local_7e8,(deque<Diff,_std::allocator<Diff>_> *)local_60,&local_840);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_840);
  std::__cxx11::wstring::~wstring(local_888);
  std::allocator<wchar_t>::~allocator(&local_889);
  std::__cxx11::wstring::~wstring(local_860);
  std::allocator<wchar_t>::~allocator(&local_861);
  std::__cxx11::wstring::~wstring((wstring *)&local_7e8);
  std::allocator<wchar_t>::~allocator(&local_7e9);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_928,L"ab",&local_929);
  Diff::Diff(&local_908,Equal,local_928);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_978,L"123",&local_979);
  Diff::Diff(&local_958,Insert,local_978);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_9c8,L"c",&local_9c9);
  Diff::Diff(&local_9a8,Equal,local_9c8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_a18,L"",&local_a19);
  Diff::Diff(&local_9f8,Insert,local_a18);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_a68,L"",&local_a69);
  Diff::Diff(&local_a48,Insert,local_a68);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_ab8,L"",&local_ab9);
  Diff::Diff(&local_a98,Insert,local_ab8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_b08,L"",&local_b09);
  Diff::Diff(&local_ae8,Insert,local_b08);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_b58,L"",&local_b59);
  Diff::Diff(&local_b38,Insert,local_b58);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_ba8,L"",&local_ba9);
  Diff::Diff(&local_b88,Insert,local_ba8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_bf8,L"",&local_bf9);
  Diff::Diff(&local_bd8,Insert,local_bf8);
  diffList(&local_8e0,this,&local_908,&local_958,&local_9a8,&local_9f8,&local_a48,&local_a98,
           &local_ae8,&local_b38,&local_b88,&local_bd8);
  std::deque<Diff,_std::allocator<Diff>_>::operator=
            ((deque<Diff,_std::allocator<Diff>_> *)local_60,&local_8e0);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_8e0);
  Diff::~Diff(&local_bd8);
  std::__cxx11::wstring::~wstring(local_bf8);
  std::allocator<wchar_t>::~allocator(&local_bf9);
  Diff::~Diff(&local_b88);
  std::__cxx11::wstring::~wstring(local_ba8);
  std::allocator<wchar_t>::~allocator(&local_ba9);
  Diff::~Diff(&local_b38);
  std::__cxx11::wstring::~wstring(local_b58);
  std::allocator<wchar_t>::~allocator(&local_b59);
  Diff::~Diff(&local_ae8);
  std::__cxx11::wstring::~wstring(local_b08);
  std::allocator<wchar_t>::~allocator(&local_b09);
  Diff::~Diff(&local_a98);
  std::__cxx11::wstring::~wstring(local_ab8);
  std::allocator<wchar_t>::~allocator(&local_ab9);
  Diff::~Diff(&local_a48);
  std::__cxx11::wstring::~wstring(local_a68);
  std::allocator<wchar_t>::~allocator(&local_a69);
  Diff::~Diff(&local_9f8);
  std::__cxx11::wstring::~wstring(local_a18);
  std::allocator<wchar_t>::~allocator(&local_a19);
  Diff::~Diff(&local_9a8);
  std::__cxx11::wstring::~wstring(local_9c8);
  std::allocator<wchar_t>::~allocator(&local_9c9);
  Diff::~Diff(&local_958);
  std::__cxx11::wstring::~wstring(local_978);
  std::allocator<wchar_t>::~allocator(&local_979);
  Diff::~Diff(&local_908);
  std::__cxx11::wstring::~wstring(local_928);
  std::allocator<wchar_t>::~allocator(&local_929);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_c20,L"diff_main: Simple insertion.",&local_c21);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_c98,L"abc",&local_c99);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_cc0,L"ab123c",&local_cc1);
  diff_match_patch::diff_main((wstring *)&local_c78,(wstring *)this,SUB81(local_c98,0));
  assertEquals(this,&local_c20,(deque<Diff,_std::allocator<Diff>_> *)local_60,&local_c78);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_c78);
  std::__cxx11::wstring::~wstring(local_cc0);
  std::allocator<wchar_t>::~allocator(&local_cc1);
  std::__cxx11::wstring::~wstring(local_c98);
  std::allocator<wchar_t>::~allocator(&local_c99);
  std::__cxx11::wstring::~wstring((wstring *)&local_c20);
  std::allocator<wchar_t>::~allocator(&local_c21);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_d60,L"a",&local_d61);
  Diff::Diff(&local_d40,Equal,local_d60);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_db0,L"123",&local_db1);
  Diff::Diff(&local_d90,Delete,local_db0);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_e00,L"bc",&local_e01);
  Diff::Diff(&local_de0,Equal,local_e00);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_e50,L"",&local_e51);
  Diff::Diff(&local_e30,Insert,local_e50);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_ea0,L"",&local_ea1);
  Diff::Diff(&local_e80,Insert,local_ea0);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_ef0,L"",&local_ef1);
  Diff::Diff(&local_ed0,Insert,local_ef0);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_f40,L"",&local_f41);
  Diff::Diff(&local_f20,Insert,local_f40);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_f90,L"",&local_f91);
  Diff::Diff(&local_f70,Insert,local_f90);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_fe0,L"",&local_fe1);
  Diff::Diff(&local_fc0,Insert,local_fe0);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1030,L"",&local_1031);
  Diff::Diff(&local_1010,Insert,local_1030);
  diffList(&local_d18,this,&local_d40,&local_d90,&local_de0,&local_e30,&local_e80,&local_ed0,
           &local_f20,&local_f70,&local_fc0,&local_1010);
  std::deque<Diff,_std::allocator<Diff>_>::operator=
            ((deque<Diff,_std::allocator<Diff>_> *)local_60,&local_d18);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_d18);
  Diff::~Diff(&local_1010);
  std::__cxx11::wstring::~wstring(local_1030);
  std::allocator<wchar_t>::~allocator(&local_1031);
  Diff::~Diff(&local_fc0);
  std::__cxx11::wstring::~wstring(local_fe0);
  std::allocator<wchar_t>::~allocator(&local_fe1);
  Diff::~Diff(&local_f70);
  std::__cxx11::wstring::~wstring(local_f90);
  std::allocator<wchar_t>::~allocator(&local_f91);
  Diff::~Diff(&local_f20);
  std::__cxx11::wstring::~wstring(local_f40);
  std::allocator<wchar_t>::~allocator(&local_f41);
  Diff::~Diff(&local_ed0);
  std::__cxx11::wstring::~wstring(local_ef0);
  std::allocator<wchar_t>::~allocator(&local_ef1);
  Diff::~Diff(&local_e80);
  std::__cxx11::wstring::~wstring(local_ea0);
  std::allocator<wchar_t>::~allocator(&local_ea1);
  Diff::~Diff(&local_e30);
  std::__cxx11::wstring::~wstring(local_e50);
  std::allocator<wchar_t>::~allocator(&local_e51);
  Diff::~Diff(&local_de0);
  std::__cxx11::wstring::~wstring(local_e00);
  std::allocator<wchar_t>::~allocator(&local_e01);
  Diff::~Diff(&local_d90);
  std::__cxx11::wstring::~wstring(local_db0);
  std::allocator<wchar_t>::~allocator(&local_db1);
  Diff::~Diff(&local_d40);
  std::__cxx11::wstring::~wstring(local_d60);
  std::allocator<wchar_t>::~allocator(&local_d61);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_1058,L"diff_main: Simple deletion.",&local_1059);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_10d0,L"a123bc",&local_10d1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_10f8,L"abc",&local_10f9);
  diff_match_patch::diff_main((wstring *)&local_10b0,(wstring *)this,SUB81(local_10d0,0));
  assertEquals(this,&local_1058,(deque<Diff,_std::allocator<Diff>_> *)local_60,&local_10b0);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_10b0);
  std::__cxx11::wstring::~wstring(local_10f8);
  std::allocator<wchar_t>::~allocator(&local_10f9);
  std::__cxx11::wstring::~wstring(local_10d0);
  std::allocator<wchar_t>::~allocator(&local_10d1);
  std::__cxx11::wstring::~wstring((wstring *)&local_1058);
  std::allocator<wchar_t>::~allocator(&local_1059);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1198,L"a",&local_1199);
  Diff::Diff(&local_1178,Equal,local_1198);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_11e8,L"123",&local_11e9);
  Diff::Diff(&local_11c8,Insert,local_11e8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1238,L"b",&local_1239);
  Diff::Diff(&local_1218,Equal,local_1238);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1288,L"456",&local_1289);
  Diff::Diff(&local_1268,Insert,local_1288);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_12d8,L"c",&local_12d9);
  Diff::Diff(&local_12b8,Equal,local_12d8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1328,L"",&local_1329);
  Diff::Diff(&local_1308,Insert,local_1328);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1378,L"",&local_1379);
  Diff::Diff(&local_1358,Insert,local_1378);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_13c8,L"",&local_13c9);
  Diff::Diff(&local_13a8,Insert,local_13c8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1418,L"",&local_1419);
  Diff::Diff(&local_13f8,Insert,local_1418);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1468,L"",&local_1469);
  Diff::Diff(&local_1448,Insert,local_1468);
  diffList(&local_1150,this,&local_1178,&local_11c8,&local_1218,&local_1268,&local_12b8,&local_1308,
           &local_1358,&local_13a8,&local_13f8,&local_1448);
  std::deque<Diff,_std::allocator<Diff>_>::operator=
            ((deque<Diff,_std::allocator<Diff>_> *)local_60,&local_1150);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_1150);
  Diff::~Diff(&local_1448);
  std::__cxx11::wstring::~wstring(local_1468);
  std::allocator<wchar_t>::~allocator(&local_1469);
  Diff::~Diff(&local_13f8);
  std::__cxx11::wstring::~wstring(local_1418);
  std::allocator<wchar_t>::~allocator(&local_1419);
  Diff::~Diff(&local_13a8);
  std::__cxx11::wstring::~wstring(local_13c8);
  std::allocator<wchar_t>::~allocator(&local_13c9);
  Diff::~Diff(&local_1358);
  std::__cxx11::wstring::~wstring(local_1378);
  std::allocator<wchar_t>::~allocator(&local_1379);
  Diff::~Diff(&local_1308);
  std::__cxx11::wstring::~wstring(local_1328);
  std::allocator<wchar_t>::~allocator(&local_1329);
  Diff::~Diff(&local_12b8);
  std::__cxx11::wstring::~wstring(local_12d8);
  std::allocator<wchar_t>::~allocator(&local_12d9);
  Diff::~Diff(&local_1268);
  std::__cxx11::wstring::~wstring(local_1288);
  std::allocator<wchar_t>::~allocator(&local_1289);
  Diff::~Diff(&local_1218);
  std::__cxx11::wstring::~wstring(local_1238);
  std::allocator<wchar_t>::~allocator(&local_1239);
  Diff::~Diff(&local_11c8);
  std::__cxx11::wstring::~wstring(local_11e8);
  std::allocator<wchar_t>::~allocator(&local_11e9);
  Diff::~Diff(&local_1178);
  std::__cxx11::wstring::~wstring(local_1198);
  std::allocator<wchar_t>::~allocator(&local_1199);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_1490,L"diff_main: Two insertions.",&local_1491);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1508,L"abc",&local_1509);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1530,L"a123b456c",&local_1531);
  diff_match_patch::diff_main((wstring *)&local_14e8,(wstring *)this,SUB81(local_1508,0));
  assertEquals(this,&local_1490,(deque<Diff,_std::allocator<Diff>_> *)local_60,&local_14e8);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_14e8);
  std::__cxx11::wstring::~wstring(local_1530);
  std::allocator<wchar_t>::~allocator(&local_1531);
  std::__cxx11::wstring::~wstring(local_1508);
  std::allocator<wchar_t>::~allocator(&local_1509);
  std::__cxx11::wstring::~wstring((wstring *)&local_1490);
  std::allocator<wchar_t>::~allocator(&local_1491);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_15d0,L"a",&local_15d1);
  Diff::Diff(&local_15b0,Equal,local_15d0);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1620,L"123",&local_1621);
  Diff::Diff(&local_1600,Delete,local_1620);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1670,L"b",&local_1671);
  Diff::Diff(&local_1650,Equal,local_1670);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_16c0,L"456",&local_16c1);
  Diff::Diff(&local_16a0,Delete,local_16c0);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1710,L"c",&local_1711);
  Diff::Diff(&local_16f0,Equal,local_1710);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1760,L"",&local_1761);
  Diff::Diff(&local_1740,Insert,local_1760);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_17b0,L"",&local_17b1);
  Diff::Diff(&local_1790,Insert,local_17b0);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1800,L"",&local_1801);
  Diff::Diff(&local_17e0,Insert,local_1800);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1850,L"",&local_1851);
  Diff::Diff(&local_1830,Insert,local_1850);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_18a0,L"",&local_18a1);
  Diff::Diff(&local_1880,Insert,local_18a0);
  diffList(&local_1588,this,&local_15b0,&local_1600,&local_1650,&local_16a0,&local_16f0,&local_1740,
           &local_1790,&local_17e0,&local_1830,&local_1880);
  std::deque<Diff,_std::allocator<Diff>_>::operator=
            ((deque<Diff,_std::allocator<Diff>_> *)local_60,&local_1588);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_1588);
  Diff::~Diff(&local_1880);
  std::__cxx11::wstring::~wstring(local_18a0);
  std::allocator<wchar_t>::~allocator(&local_18a1);
  Diff::~Diff(&local_1830);
  std::__cxx11::wstring::~wstring(local_1850);
  std::allocator<wchar_t>::~allocator(&local_1851);
  Diff::~Diff(&local_17e0);
  std::__cxx11::wstring::~wstring(local_1800);
  std::allocator<wchar_t>::~allocator(&local_1801);
  Diff::~Diff(&local_1790);
  std::__cxx11::wstring::~wstring(local_17b0);
  std::allocator<wchar_t>::~allocator(&local_17b1);
  Diff::~Diff(&local_1740);
  std::__cxx11::wstring::~wstring(local_1760);
  std::allocator<wchar_t>::~allocator(&local_1761);
  Diff::~Diff(&local_16f0);
  std::__cxx11::wstring::~wstring(local_1710);
  std::allocator<wchar_t>::~allocator(&local_1711);
  Diff::~Diff(&local_16a0);
  std::__cxx11::wstring::~wstring(local_16c0);
  std::allocator<wchar_t>::~allocator(&local_16c1);
  Diff::~Diff(&local_1650);
  std::__cxx11::wstring::~wstring(local_1670);
  std::allocator<wchar_t>::~allocator(&local_1671);
  Diff::~Diff(&local_1600);
  std::__cxx11::wstring::~wstring(local_1620);
  std::allocator<wchar_t>::~allocator(&local_1621);
  Diff::~Diff(&local_15b0);
  std::__cxx11::wstring::~wstring(local_15d0);
  std::allocator<wchar_t>::~allocator(&local_15d1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_18c8,L"diff_main: Two deletions.",&local_18c9);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1940,L"a123b456c",&local_1941);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1968,L"abc",&local_1969);
  diff_match_patch::diff_main((wstring *)&local_1920,(wstring *)this,SUB81(local_1940,0));
  assertEquals(this,&local_18c8,(deque<Diff,_std::allocator<Diff>_> *)local_60,&local_1920);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_1920);
  std::__cxx11::wstring::~wstring(local_1968);
  std::allocator<wchar_t>::~allocator(&local_1969);
  std::__cxx11::wstring::~wstring(local_1940);
  std::allocator<wchar_t>::~allocator(&local_1941);
  std::__cxx11::wstring::~wstring((wstring *)&local_18c8);
  std::allocator<wchar_t>::~allocator(&local_18c9);
  *(undefined4 *)this = 0;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1a08,L"a",&local_1a09);
  Diff::Diff(&local_19e8,Delete,local_1a08);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1a58,L"b",&local_1a59);
  Diff::Diff(&local_1a38,Insert,local_1a58);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1aa8,L"",&local_1aa9);
  Diff::Diff(&local_1a88,Insert,local_1aa8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1af8,L"",&local_1af9);
  Diff::Diff(&local_1ad8,Insert,local_1af8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1b48,L"",&local_1b49);
  Diff::Diff(&local_1b28,Insert,local_1b48);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1b98,L"",&local_1b99);
  Diff::Diff(&local_1b78,Insert,local_1b98);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1be8,L"",&local_1be9);
  Diff::Diff(&local_1bc8,Insert,local_1be8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1c38,L"",&local_1c39);
  Diff::Diff(&local_1c18,Insert,local_1c38);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1c88,L"",&local_1c89);
  Diff::Diff(&local_1c68,Insert,local_1c88);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1cd8,L"",&local_1cd9);
  Diff::Diff(&local_1cb8,Insert,local_1cd8);
  diffList(&local_19c0,this,&local_19e8,&local_1a38,&local_1a88,&local_1ad8,&local_1b28,&local_1b78,
           &local_1bc8,&local_1c18,&local_1c68,&local_1cb8);
  std::deque<Diff,_std::allocator<Diff>_>::operator=
            ((deque<Diff,_std::allocator<Diff>_> *)local_60,&local_19c0);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_19c0);
  Diff::~Diff(&local_1cb8);
  std::__cxx11::wstring::~wstring(local_1cd8);
  std::allocator<wchar_t>::~allocator(&local_1cd9);
  Diff::~Diff(&local_1c68);
  std::__cxx11::wstring::~wstring(local_1c88);
  std::allocator<wchar_t>::~allocator(&local_1c89);
  Diff::~Diff(&local_1c18);
  std::__cxx11::wstring::~wstring(local_1c38);
  std::allocator<wchar_t>::~allocator(&local_1c39);
  Diff::~Diff(&local_1bc8);
  std::__cxx11::wstring::~wstring(local_1be8);
  std::allocator<wchar_t>::~allocator(&local_1be9);
  Diff::~Diff(&local_1b78);
  std::__cxx11::wstring::~wstring(local_1b98);
  std::allocator<wchar_t>::~allocator(&local_1b99);
  Diff::~Diff(&local_1b28);
  std::__cxx11::wstring::~wstring(local_1b48);
  std::allocator<wchar_t>::~allocator(&local_1b49);
  Diff::~Diff(&local_1ad8);
  std::__cxx11::wstring::~wstring(local_1af8);
  std::allocator<wchar_t>::~allocator(&local_1af9);
  Diff::~Diff(&local_1a88);
  std::__cxx11::wstring::~wstring(local_1aa8);
  std::allocator<wchar_t>::~allocator(&local_1aa9);
  Diff::~Diff(&local_1a38);
  std::__cxx11::wstring::~wstring(local_1a58);
  std::allocator<wchar_t>::~allocator(&local_1a59);
  Diff::~Diff(&local_19e8);
  std::__cxx11::wstring::~wstring(local_1a08);
  std::allocator<wchar_t>::~allocator(&local_1a09);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_1d00,L"diff_main: Simple case #1.",&local_1d01);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1d78,L"a",&local_1d79);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1da0,L"b",&local_1da1);
  diff_match_patch::diff_main((wstring *)&local_1d58,(wstring *)this,SUB81(local_1d78,0));
  assertEquals(this,&local_1d00,(deque<Diff,_std::allocator<Diff>_> *)local_60,&local_1d58);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_1d58);
  std::__cxx11::wstring::~wstring(local_1da0);
  std::allocator<wchar_t>::~allocator(&local_1da1);
  std::__cxx11::wstring::~wstring(local_1d78);
  std::allocator<wchar_t>::~allocator(&local_1d79);
  std::__cxx11::wstring::~wstring((wstring *)&local_1d00);
  std::allocator<wchar_t>::~allocator(&local_1d01);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1e40,L"Apple",&local_1e41);
  Diff::Diff(&local_1e20,Delete,local_1e40);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1e90,L"Banana",&local_1e91);
  Diff::Diff(&local_1e70,Insert,local_1e90);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1ee0,L"s are a",&local_1ee1);
  Diff::Diff(&local_1ec0,Equal,local_1ee0);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1f30,L"lso",&local_1f31);
  Diff::Diff(&local_1f10,Insert,local_1f30);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1f80,L" fruit.",&local_1f81);
  Diff::Diff(&local_1f60,Equal,local_1f80);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1fd0,L"",&local_1fd1);
  Diff::Diff(&local_1fb0,Insert,local_1fd0);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2020,L"",&local_2021);
  Diff::Diff(&local_2000,Insert,local_2020);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2070,L"",&local_2071);
  Diff::Diff(&local_2050,Insert,local_2070);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_20c0,L"",&local_20c1);
  Diff::Diff(&local_20a0,Insert,local_20c0);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2110,L"",&local_2111);
  Diff::Diff(&local_20f0,Insert,local_2110);
  diffList(&local_1df8,this,&local_1e20,&local_1e70,&local_1ec0,&local_1f10,&local_1f60,&local_1fb0,
           &local_2000,&local_2050,&local_20a0,&local_20f0);
  std::deque<Diff,_std::allocator<Diff>_>::operator=
            ((deque<Diff,_std::allocator<Diff>_> *)local_60,&local_1df8);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_1df8);
  Diff::~Diff(&local_20f0);
  std::__cxx11::wstring::~wstring(local_2110);
  std::allocator<wchar_t>::~allocator(&local_2111);
  Diff::~Diff(&local_20a0);
  std::__cxx11::wstring::~wstring(local_20c0);
  std::allocator<wchar_t>::~allocator(&local_20c1);
  Diff::~Diff(&local_2050);
  std::__cxx11::wstring::~wstring(local_2070);
  std::allocator<wchar_t>::~allocator(&local_2071);
  Diff::~Diff(&local_2000);
  std::__cxx11::wstring::~wstring(local_2020);
  std::allocator<wchar_t>::~allocator(&local_2021);
  Diff::~Diff(&local_1fb0);
  std::__cxx11::wstring::~wstring(local_1fd0);
  std::allocator<wchar_t>::~allocator(&local_1fd1);
  Diff::~Diff(&local_1f60);
  std::__cxx11::wstring::~wstring(local_1f80);
  std::allocator<wchar_t>::~allocator(&local_1f81);
  Diff::~Diff(&local_1f10);
  std::__cxx11::wstring::~wstring(local_1f30);
  std::allocator<wchar_t>::~allocator(&local_1f31);
  Diff::~Diff(&local_1ec0);
  std::__cxx11::wstring::~wstring(local_1ee0);
  std::allocator<wchar_t>::~allocator(&local_1ee1);
  Diff::~Diff(&local_1e70);
  std::__cxx11::wstring::~wstring(local_1e90);
  std::allocator<wchar_t>::~allocator(&local_1e91);
  Diff::~Diff(&local_1e20);
  std::__cxx11::wstring::~wstring(local_1e40);
  std::allocator<wchar_t>::~allocator(&local_1e41);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_2138,L"diff_main: Simple case #2.",&local_2139);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_21b0,L"Apples are a fruit.",&local_21b1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_21d8,L"Bananas are also fruit.",&local_21d9);
  diff_match_patch::diff_main((wstring *)&local_2190,(wstring *)this,SUB81(local_21b0,0));
  assertEquals(this,&local_2138,(deque<Diff,_std::allocator<Diff>_> *)local_60,&local_2190);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_2190);
  std::__cxx11::wstring::~wstring(local_21d8);
  std::allocator<wchar_t>::~allocator(&local_21d9);
  std::__cxx11::wstring::~wstring(local_21b0);
  std::allocator<wchar_t>::~allocator(&local_21b1);
  std::__cxx11::wstring::~wstring((wstring *)&local_2138);
  std::allocator<wchar_t>::~allocator(&local_2139);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2278,L"a",&local_2279);
  Diff::Diff(&local_2258,Delete,local_2278);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring(local_22c8,L"ڀ",1,&local_22c9);
  Diff::Diff(&local_22a8,Insert,local_22c8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2318,L"x",&local_2319);
  Diff::Diff(&local_22f8,Equal,local_2318);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2368,L"\t",&local_2369);
  Diff::Diff(&local_2348,Delete,local_2368);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring(local_23b8,L"",1,&local_23b9);
  Diff::Diff(&local_2398,Insert,local_23b8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2408,L"",&local_2409);
  Diff::Diff(&local_23e8,Insert,local_2408);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2458,L"",&local_2459);
  Diff::Diff(&local_2438,Insert,local_2458);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_24a8,L"",&local_24a9);
  Diff::Diff(&local_2488,Insert,local_24a8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_24f8,L"",&local_24f9);
  Diff::Diff(&local_24d8,Insert,local_24f8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2548,L"",&local_2549);
  Diff::Diff(&local_2528,Insert,local_2548);
  diffList(&local_2230,this,&local_2258,&local_22a8,&local_22f8,&local_2348,&local_2398,&local_23e8,
           &local_2438,&local_2488,&local_24d8,&local_2528);
  std::deque<Diff,_std::allocator<Diff>_>::operator=
            ((deque<Diff,_std::allocator<Diff>_> *)local_60,&local_2230);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_2230);
  Diff::~Diff(&local_2528);
  std::__cxx11::wstring::~wstring(local_2548);
  std::allocator<wchar_t>::~allocator(&local_2549);
  Diff::~Diff(&local_24d8);
  std::__cxx11::wstring::~wstring(local_24f8);
  std::allocator<wchar_t>::~allocator(&local_24f9);
  Diff::~Diff(&local_2488);
  std::__cxx11::wstring::~wstring(local_24a8);
  std::allocator<wchar_t>::~allocator(&local_24a9);
  Diff::~Diff(&local_2438);
  std::__cxx11::wstring::~wstring(local_2458);
  std::allocator<wchar_t>::~allocator(&local_2459);
  Diff::~Diff(&local_23e8);
  std::__cxx11::wstring::~wstring(local_2408);
  std::allocator<wchar_t>::~allocator(&local_2409);
  Diff::~Diff(&local_2398);
  std::__cxx11::wstring::~wstring(local_23b8);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_23b9);
  Diff::~Diff(&local_2348);
  std::__cxx11::wstring::~wstring(local_2368);
  std::allocator<wchar_t>::~allocator(&local_2369);
  Diff::~Diff(&local_22f8);
  std::__cxx11::wstring::~wstring(local_2318);
  std::allocator<wchar_t>::~allocator(&local_2319);
  Diff::~Diff(&local_22a8);
  std::__cxx11::wstring::~wstring(local_22c8);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_22c9);
  Diff::~Diff(&local_2258);
  std::__cxx11::wstring::~wstring(local_2278);
  std::allocator<wchar_t>::~allocator(&local_2279);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_2570,L"diff_main: Simple case #3.",&local_2571);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_25e8,L"ax\t",&local_25e9);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring(local_2610,L"ڀx",3,&local_2611);
  diff_match_patch::diff_main((wstring *)&local_25c8,(wstring *)this,SUB81(local_25e8,0));
  assertEquals(this,&local_2570,(deque<Diff,_std::allocator<Diff>_> *)local_60,&local_25c8);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_25c8);
  std::__cxx11::wstring::~wstring(local_2610);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_2611);
  std::__cxx11::wstring::~wstring(local_25e8);
  std::allocator<wchar_t>::~allocator(&local_25e9);
  std::__cxx11::wstring::~wstring((wstring *)&local_2570);
  std::allocator<wchar_t>::~allocator(&local_2571);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_26b0,L"1",&local_26b1);
  Diff::Diff(&local_2690,Delete,local_26b0);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2700,L"a",&local_2701);
  Diff::Diff(&local_26e0,Equal,local_2700);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2750,L"y",&local_2751);
  Diff::Diff(&local_2730,Delete,local_2750);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_27a0,L"b",&local_27a1);
  Diff::Diff(&local_2780,Equal,local_27a0);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_27f0,L"2",&local_27f1);
  Diff::Diff(&local_27d0,Delete,local_27f0);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2840,L"xab",&local_2841);
  Diff::Diff(&local_2820,Insert,local_2840);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2890,L"",&local_2891);
  Diff::Diff(&local_2870,Insert,local_2890);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_28e0,L"",&local_28e1);
  Diff::Diff(&local_28c0,Insert,local_28e0);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2930,L"",&local_2931);
  Diff::Diff(&local_2910,Insert,local_2930);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2980,L"",&local_2981);
  Diff::Diff(&local_2960,Insert,local_2980);
  diffList(&local_2668,this,&local_2690,&local_26e0,&local_2730,&local_2780,&local_27d0,&local_2820,
           &local_2870,&local_28c0,&local_2910,&local_2960);
  std::deque<Diff,_std::allocator<Diff>_>::operator=
            ((deque<Diff,_std::allocator<Diff>_> *)local_60,&local_2668);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_2668);
  Diff::~Diff(&local_2960);
  std::__cxx11::wstring::~wstring(local_2980);
  std::allocator<wchar_t>::~allocator(&local_2981);
  Diff::~Diff(&local_2910);
  std::__cxx11::wstring::~wstring(local_2930);
  std::allocator<wchar_t>::~allocator(&local_2931);
  Diff::~Diff(&local_28c0);
  std::__cxx11::wstring::~wstring(local_28e0);
  std::allocator<wchar_t>::~allocator(&local_28e1);
  Diff::~Diff(&local_2870);
  std::__cxx11::wstring::~wstring(local_2890);
  std::allocator<wchar_t>::~allocator(&local_2891);
  Diff::~Diff(&local_2820);
  std::__cxx11::wstring::~wstring(local_2840);
  std::allocator<wchar_t>::~allocator(&local_2841);
  Diff::~Diff(&local_27d0);
  std::__cxx11::wstring::~wstring(local_27f0);
  std::allocator<wchar_t>::~allocator(&local_27f1);
  Diff::~Diff(&local_2780);
  std::__cxx11::wstring::~wstring(local_27a0);
  std::allocator<wchar_t>::~allocator(&local_27a1);
  Diff::~Diff(&local_2730);
  std::__cxx11::wstring::~wstring(local_2750);
  std::allocator<wchar_t>::~allocator(&local_2751);
  Diff::~Diff(&local_26e0);
  std::__cxx11::wstring::~wstring(local_2700);
  std::allocator<wchar_t>::~allocator(&local_2701);
  Diff::~Diff(&local_2690);
  std::__cxx11::wstring::~wstring(local_26b0);
  std::allocator<wchar_t>::~allocator(&local_26b1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_29a8,L"diff_main: Overlap #1.",&local_29a9);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2a20,L"1ayb2",&local_2a21);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2a48,L"abxab",&local_2a49);
  diff_match_patch::diff_main((wstring *)&local_2a00,(wstring *)this,SUB81(local_2a20,0));
  assertEquals(this,&local_29a8,(deque<Diff,_std::allocator<Diff>_> *)local_60,&local_2a00);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_2a00);
  std::__cxx11::wstring::~wstring(local_2a48);
  std::allocator<wchar_t>::~allocator(&local_2a49);
  std::__cxx11::wstring::~wstring(local_2a20);
  std::allocator<wchar_t>::~allocator(&local_2a21);
  std::__cxx11::wstring::~wstring((wstring *)&local_29a8);
  std::allocator<wchar_t>::~allocator(&local_29a9);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2ae8,L"xaxcx",&local_2ae9);
  Diff::Diff(&local_2ac8,Insert,local_2ae8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2b38,L"abc",&local_2b39);
  Diff::Diff(&local_2b18,Equal,local_2b38);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2b88,L"y",&local_2b89);
  Diff::Diff(&local_2b68,Delete,local_2b88);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2bd8,L"",&local_2bd9);
  Diff::Diff(&local_2bb8,Insert,local_2bd8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2c28,L"",&local_2c29);
  Diff::Diff(&local_2c08,Insert,local_2c28);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2c78,L"",&local_2c79);
  Diff::Diff(&local_2c58,Insert,local_2c78);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2cc8,L"",&local_2cc9);
  Diff::Diff(&local_2ca8,Insert,local_2cc8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2d18,L"",&local_2d19);
  Diff::Diff(&local_2cf8,Insert,local_2d18);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2d68,L"",&local_2d69);
  Diff::Diff(&local_2d48,Insert,local_2d68);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2db8,L"",&local_2db9);
  Diff::Diff(&local_2d98,Insert,local_2db8);
  diffList(&local_2aa0,this,&local_2ac8,&local_2b18,&local_2b68,&local_2bb8,&local_2c08,&local_2c58,
           &local_2ca8,&local_2cf8,&local_2d48,&local_2d98);
  std::deque<Diff,_std::allocator<Diff>_>::operator=
            ((deque<Diff,_std::allocator<Diff>_> *)local_60,&local_2aa0);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_2aa0);
  Diff::~Diff(&local_2d98);
  std::__cxx11::wstring::~wstring(local_2db8);
  std::allocator<wchar_t>::~allocator(&local_2db9);
  Diff::~Diff(&local_2d48);
  std::__cxx11::wstring::~wstring(local_2d68);
  std::allocator<wchar_t>::~allocator(&local_2d69);
  Diff::~Diff(&local_2cf8);
  std::__cxx11::wstring::~wstring(local_2d18);
  std::allocator<wchar_t>::~allocator(&local_2d19);
  Diff::~Diff(&local_2ca8);
  std::__cxx11::wstring::~wstring(local_2cc8);
  std::allocator<wchar_t>::~allocator(&local_2cc9);
  Diff::~Diff(&local_2c58);
  std::__cxx11::wstring::~wstring(local_2c78);
  std::allocator<wchar_t>::~allocator(&local_2c79);
  Diff::~Diff(&local_2c08);
  std::__cxx11::wstring::~wstring(local_2c28);
  std::allocator<wchar_t>::~allocator(&local_2c29);
  Diff::~Diff(&local_2bb8);
  std::__cxx11::wstring::~wstring(local_2bd8);
  std::allocator<wchar_t>::~allocator(&local_2bd9);
  Diff::~Diff(&local_2b68);
  std::__cxx11::wstring::~wstring(local_2b88);
  std::allocator<wchar_t>::~allocator(&local_2b89);
  Diff::~Diff(&local_2b18);
  std::__cxx11::wstring::~wstring(local_2b38);
  std::allocator<wchar_t>::~allocator(&local_2b39);
  Diff::~Diff(&local_2ac8);
  std::__cxx11::wstring::~wstring(local_2ae8);
  std::allocator<wchar_t>::~allocator(&local_2ae9);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_2de0,L"diff_main: Overlap #2.",&local_2de1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2e58,L"abcy",&local_2e59);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2e80,L"xaxcxabc",&local_2e81);
  diff_match_patch::diff_main((wstring *)&local_2e38,(wstring *)this,SUB81(local_2e58,0));
  assertEquals(this,&local_2de0,(deque<Diff,_std::allocator<Diff>_> *)local_60,&local_2e38);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_2e38);
  std::__cxx11::wstring::~wstring(local_2e80);
  std::allocator<wchar_t>::~allocator(&local_2e81);
  std::__cxx11::wstring::~wstring(local_2e58);
  std::allocator<wchar_t>::~allocator(&local_2e59);
  std::__cxx11::wstring::~wstring((wstring *)&local_2de0);
  std::allocator<wchar_t>::~allocator(&local_2de1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2f20,L"ABCD",&local_2f21);
  Diff::Diff(&local_2f00,Delete,local_2f20);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2f70,L"a",&local_2f71);
  Diff::Diff(&local_2f50,Equal,local_2f70);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2fc0,L"=",&local_2fc1);
  Diff::Diff(&local_2fa0,Delete,local_2fc0);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_3010,L"-",&local_3011);
  Diff::Diff(&local_2ff0,Insert,local_3010);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_3060,L"bcd",&local_3061);
  Diff::Diff(&local_3040,Equal,local_3060);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_30b0,L"=",&local_30b1);
  Diff::Diff(&local_3090,Delete,local_30b0);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_3100,L"-",&local_3101);
  Diff::Diff(&local_30e0,Insert,local_3100);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_3150,L"efghijklmnopqrs",&local_3151)
  ;
  Diff::Diff(&local_3130,Equal,local_3150);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_31a0,L"EFGHIJKLMNOefg",&local_31a1);
  Diff::Diff(&local_3180,Delete,local_31a0);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_31f0,L"",&local_31f1);
  Diff::Diff(&local_31d0,Insert,local_31f0);
  diffList(&local_2ed8,this,&local_2f00,&local_2f50,&local_2fa0,&local_2ff0,&local_3040,&local_3090,
           &local_30e0,&local_3130,&local_3180,&local_31d0);
  std::deque<Diff,_std::allocator<Diff>_>::operator=
            ((deque<Diff,_std::allocator<Diff>_> *)local_60,&local_2ed8);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_2ed8);
  Diff::~Diff(&local_31d0);
  std::__cxx11::wstring::~wstring(local_31f0);
  std::allocator<wchar_t>::~allocator(&local_31f1);
  Diff::~Diff(&local_3180);
  std::__cxx11::wstring::~wstring(local_31a0);
  std::allocator<wchar_t>::~allocator(&local_31a1);
  Diff::~Diff(&local_3130);
  std::__cxx11::wstring::~wstring(local_3150);
  std::allocator<wchar_t>::~allocator(&local_3151);
  Diff::~Diff(&local_30e0);
  std::__cxx11::wstring::~wstring(local_3100);
  std::allocator<wchar_t>::~allocator(&local_3101);
  Diff::~Diff(&local_3090);
  std::__cxx11::wstring::~wstring(local_30b0);
  std::allocator<wchar_t>::~allocator(&local_30b1);
  Diff::~Diff(&local_3040);
  std::__cxx11::wstring::~wstring(local_3060);
  std::allocator<wchar_t>::~allocator(&local_3061);
  Diff::~Diff(&local_2ff0);
  std::__cxx11::wstring::~wstring(local_3010);
  std::allocator<wchar_t>::~allocator(&local_3011);
  Diff::~Diff(&local_2fa0);
  std::__cxx11::wstring::~wstring(local_2fc0);
  std::allocator<wchar_t>::~allocator(&local_2fc1);
  Diff::~Diff(&local_2f50);
  std::__cxx11::wstring::~wstring(local_2f70);
  std::allocator<wchar_t>::~allocator(&local_2f71);
  Diff::~Diff(&local_2f00);
  std::__cxx11::wstring::~wstring(local_2f20);
  std::allocator<wchar_t>::~allocator(&local_2f21);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_3218,L"diff_main: Overlap #3.",&local_3219);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_3290,L"ABCDa=bcd=efghijklmnopqrsEFGHIJKLMNOefg",&local_3291);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_32b8,L"a-bcd-efghijklmnopqrs",&local_32b9);
  diff_match_patch::diff_main((wstring *)&local_3270,(wstring *)this,SUB81(local_3290,0));
  assertEquals(this,&local_3218,(deque<Diff,_std::allocator<Diff>_> *)local_60,&local_3270);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_3270);
  std::__cxx11::wstring::~wstring(local_32b8);
  std::allocator<wchar_t>::~allocator(&local_32b9);
  std::__cxx11::wstring::~wstring(local_3290);
  std::allocator<wchar_t>::~allocator(&local_3291);
  std::__cxx11::wstring::~wstring((wstring *)&local_3218);
  std::allocator<wchar_t>::~allocator(&local_3219);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_3358,L" ",&local_3359);
  Diff::Diff(&local_3338,Insert,local_3358);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_33a8,L"a",&local_33a9);
  Diff::Diff(&local_3388,Equal,local_33a8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_33f8,L"nd",&local_33f9);
  Diff::Diff(&local_33d8,Insert,local_33f8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_3448,L" [[Pennsylvania]]",&local_3449);
  Diff::Diff(&local_3428,Equal,local_3448);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_3498,L" and [[New",&local_3499);
  Diff::Diff(&local_3478,Delete,local_3498);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_34e8,L"",&local_34e9);
  Diff::Diff(&local_34c8,Insert,local_34e8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_3538,L"",&local_3539);
  Diff::Diff(&local_3518,Insert,local_3538);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_3588,L"",&local_3589);
  Diff::Diff(&local_3568,Insert,local_3588);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_35d8,L"",&local_35d9);
  Diff::Diff(&local_35b8,Insert,local_35d8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_3628,L"",&local_3629);
  Diff::Diff(&local_3608,Insert,local_3628);
  diffList(&local_3310,this,&local_3338,&local_3388,&local_33d8,&local_3428,&local_3478,&local_34c8,
           &local_3518,&local_3568,&local_35b8,&local_3608);
  std::deque<Diff,_std::allocator<Diff>_>::operator=
            ((deque<Diff,_std::allocator<Diff>_> *)local_60,&local_3310);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_3310);
  Diff::~Diff(&local_3608);
  std::__cxx11::wstring::~wstring(local_3628);
  std::allocator<wchar_t>::~allocator(&local_3629);
  Diff::~Diff(&local_35b8);
  std::__cxx11::wstring::~wstring(local_35d8);
  std::allocator<wchar_t>::~allocator(&local_35d9);
  Diff::~Diff(&local_3568);
  std::__cxx11::wstring::~wstring(local_3588);
  std::allocator<wchar_t>::~allocator(&local_3589);
  Diff::~Diff(&local_3518);
  std::__cxx11::wstring::~wstring(local_3538);
  std::allocator<wchar_t>::~allocator(&local_3539);
  Diff::~Diff(&local_34c8);
  std::__cxx11::wstring::~wstring(local_34e8);
  std::allocator<wchar_t>::~allocator(&local_34e9);
  Diff::~Diff(&local_3478);
  std::__cxx11::wstring::~wstring(local_3498);
  std::allocator<wchar_t>::~allocator(&local_3499);
  Diff::~Diff(&local_3428);
  std::__cxx11::wstring::~wstring(local_3448);
  std::allocator<wchar_t>::~allocator(&local_3449);
  Diff::~Diff(&local_33d8);
  std::__cxx11::wstring::~wstring(local_33f8);
  std::allocator<wchar_t>::~allocator(&local_33f9);
  Diff::~Diff(&local_3388);
  std::__cxx11::wstring::~wstring(local_33a8);
  std::allocator<wchar_t>::~allocator(&local_33a9);
  Diff::~Diff(&local_3338);
  std::__cxx11::wstring::~wstring(local_3358);
  std::allocator<wchar_t>::~allocator(&local_3359);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_3650,L"diff_main: Large equality.",&local_3651);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_36c8,L"a [[Pennsylvania]] and [[New",&local_36c9);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_36f0,L" and [[Pennsylvania]]",(allocator<wchar_t> *)((long)&a.field_2 + 0xf));
  diff_match_patch::diff_main((wstring *)&local_36a8,(wstring *)this,SUB81(local_36c8,0));
  assertEquals(this,&local_3650,(deque<Diff,_std::allocator<Diff>_> *)local_60,&local_36a8);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_36a8);
  std::__cxx11::wstring::~wstring(local_36f0);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)((long)&a.field_2 + 0xf));
  std::__cxx11::wstring::~wstring(local_36c8);
  std::allocator<wchar_t>::~allocator(&local_36c9);
  std::__cxx11::wstring::~wstring((wstring *)&local_3650);
  std::allocator<wchar_t>::~allocator(&local_3651);
  *(undefined4 *)this = 0x3dcccccd;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)local_3718,
             L"`Twas brillig, and the slithy toves\nDid gyre and gimble in the wabe:\nAll mimsy were the borogoves,\nAnd the mome raths outgrabe.\n"
             ,(allocator<wchar_t> *)((long)&b.field_2 + 0xf));
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)((long)&b.field_2 + 0xf));
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&x,
             L"I am the very model of a modern major general,\nI\'ve information vegetable, animal, and mineral,\nI know the kings of England, and I quote the fights historical,\nFrom Marathon to Waterloo, in order categorical.\n"
             ,&local_3741);
  std::allocator<wchar_t>::~allocator(&local_3741);
  for (local_3748 = 0; local_3748 < 10; local_3748 = local_3748 + 1) {
    std::operator+(&local_3768,
                   (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   local_3718,
                   (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   local_3718);
    std::__cxx11::wstring::operator=((wstring *)local_3718,(wstring *)&local_3768);
    std::__cxx11::wstring::~wstring((wstring *)&local_3768);
    std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &startTime,
                   (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&x,
                   (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&x)
    ;
    std::__cxx11::wstring::operator=((wstring *)&x,(wstring *)&startTime);
    std::__cxx11::wstring::~wstring((wstring *)&startTime);
  }
  local_3790 = clock();
  diff_match_patch::diff_main((wstring *)&endTime,(wstring *)this);
  std::deque<Diff,_std::allocator<Diff>_>::~deque((deque<Diff,_std::allocator<Diff>_> *)&endTime);
  local_37e8 = clock();
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_3808,L"diff_main: Timeout min.",&local_3809);
  assertTrue(this,&local_3808,*(float *)this * 1e+06 <= (float)(local_37e8 - local_3790));
  std::__cxx11::wstring::~wstring((wstring *)&local_3808);
  std::allocator<wchar_t>::~allocator(&local_3809);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_3830,L"diff_main: Timeout max.",&local_3831);
  assertTrue(this,&local_3830,
             (float)(local_37e8 - local_3790) < *(float *)this * 1e+06 + *(float *)this * 1e+06);
  std::__cxx11::wstring::~wstring((wstring *)&local_3830);
  std::allocator<wchar_t>::~allocator(&local_3831);
  *(undefined4 *)this = 0;
  std::__cxx11::wstring::operator=
            ((wstring *)local_3718,
             L"1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n"
            );
  std::__cxx11::wstring::operator=
            ((wstring *)&x,
             L"abcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\n"
            );
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_3858,L"diff_main: Simple line-mode.",&local_3859);
  diff_match_patch::diff_main((wstring *)&local_38b0,(wstring *)this,SUB81(local_3718,0));
  diff_match_patch::diff_main((wstring *)&local_3900,(wstring *)this,SUB81(local_3718,0));
  assertEquals(this,&local_3858,&local_38b0,&local_3900);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_3900);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_38b0);
  std::__cxx11::wstring::~wstring((wstring *)&local_3858);
  std::allocator<wchar_t>::~allocator(&local_3859);
  std::__cxx11::wstring::operator=
            ((wstring *)local_3718,
             L"1234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890"
            );
  std::__cxx11::wstring::operator=
            ((wstring *)&x,
             L"abcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghij"
            );
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_3920,L"diff_main: Single line-mode.",&local_3921);
  diff_match_patch::diff_main((wstring *)&local_3978,(wstring *)this,SUB81(local_3718,0));
  diff_match_patch::diff_main
            ((wstring *)
             &texts_linemode.
              super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,(wstring *)this,SUB81(local_3718,0))
  ;
  assertEquals(this,&local_3920,&local_3978,
               (deque<Diff,_std::allocator<Diff>_> *)
               &texts_linemode.
                super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)
             &texts_linemode.
              super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_3978);
  std::__cxx11::wstring::~wstring((wstring *)&local_3920);
  std::allocator<wchar_t>::~allocator(&local_3921);
  std::__cxx11::wstring::operator=
            ((wstring *)local_3718,
             L"1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n"
            );
  std::__cxx11::wstring::operator=
            ((wstring *)&x,
             L"abcdefghij\n1234567890\n1234567890\n1234567890\nabcdefghij\n1234567890\n1234567890\n1234567890\nabcdefghij\n1234567890\n1234567890\n1234567890\nabcdefghij\n"
            );
  diff_match_patch::diff_main
            ((wstring *)
             &texts_textmode.
              super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,(wstring *)this,SUB81(local_3718,0))
  ;
  diff_rebuildtexts_abi_cxx11_
            ((deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *)local_3a18,this,
             (deque<Diff,_std::allocator<Diff>_> *)
             &texts_textmode.
              super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::deque<Diff,_std::allocator<Diff>_>::~deque
            ((deque<Diff,_std::allocator<Diff>_> *)
             &texts_textmode.
              super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  diff_match_patch::diff_main((wstring *)&local_3b08,(wstring *)this,SUB81(local_3718,0));
  diff_rebuildtexts_abi_cxx11_
            ((deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *)local_3ab8,this,&local_3b08);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_3b08);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_3b28,L"diff_main: Overlap line-mode.",&local_3b29);
  assertEquals(this,&local_3b28,
               (deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                *)local_3ab8,
               (deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                *)local_3a18);
  std::__cxx11::wstring::~wstring((wstring *)&local_3b28);
  std::allocator<wchar_t>::~allocator(&local_3b29);
  std::
  deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            *)local_3ab8);
  std::
  deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            *)local_3a18);
  std::__cxx11::wstring::~wstring((wstring *)&x);
  std::__cxx11::wstring::~wstring((wstring *)local_3718);
  std::deque<Diff,_std::allocator<Diff>_>::~deque((deque<Diff,_std::allocator<Diff>_> *)local_60);
  return;
}

Assistant:

void diff_match_patch_test::testDiffMain() {
  // Perform a trivial diff.
  std::deque<Diff> diffs = diffList();
  assertEquals(L"diff_main: Null case.", diffs, dmp.diff_main(L"", L"", false));

  diffs = diffList(Diff(Diff::Operation::Equal, L"abc"));
  assertEquals(L"diff_main: Equality.", diffs, dmp.diff_main(L"abc", L"abc", false));

  diffs = diffList(Diff(Diff::Operation::Equal, L"ab"), Diff(Diff::Operation::Insert, L"123"), Diff(Diff::Operation::Equal, L"c"));
  assertEquals(L"diff_main: Simple insertion.", diffs, dmp.diff_main(L"abc", L"ab123c", false));

  diffs = diffList(Diff(Diff::Operation::Equal, L"a"), Diff(Diff::Operation::Delete, L"123"), Diff(Diff::Operation::Equal, L"bc"));
  assertEquals(L"diff_main: Simple deletion.", diffs, dmp.diff_main(L"a123bc", L"abc", false));

  diffs = diffList(Diff(Diff::Operation::Equal, L"a"), Diff(Diff::Operation::Insert, L"123"), Diff(Diff::Operation::Equal, L"b"), Diff(Diff::Operation::Insert, L"456"), Diff(Diff::Operation::Equal, L"c"));
  assertEquals(L"diff_main: Two insertions.", diffs, dmp.diff_main(L"abc", L"a123b456c", false));

  diffs = diffList(Diff(Diff::Operation::Equal, L"a"), Diff(Diff::Operation::Delete, L"123"), Diff(Diff::Operation::Equal, L"b"), Diff(Diff::Operation::Delete, L"456"), Diff(Diff::Operation::Equal, L"c"));
  assertEquals(L"diff_main: Two deletions.", diffs, dmp.diff_main(L"a123b456c", L"abc", false));

  // Perform a real diff.
  // Switch off the timeout.
  dmp.Diff_Timeout = 0;
  diffs = diffList(Diff(Diff::Operation::Delete, L"a"), Diff(Diff::Operation::Insert, L"b"));
  assertEquals(L"diff_main: Simple case #1.", diffs, dmp.diff_main(L"a", L"b", false));

  diffs = diffList(Diff(Diff::Operation::Delete, L"Apple"), Diff(Diff::Operation::Insert, L"Banana"), Diff(Diff::Operation::Equal, L"s are a"), Diff(Diff::Operation::Insert, L"lso"), Diff(Diff::Operation::Equal, L" fruit."));
  assertEquals(L"diff_main: Simple case #2.", diffs, dmp.diff_main(L"Apples are a fruit.", L"Bananas are also fruit.", false));

  diffs = diffList(Diff(Diff::Operation::Delete, L"a"), Diff(Diff::Operation::Insert, std::wstring(L"\u0680", 1)), Diff(Diff::Operation::Equal, L"x"), Diff(Diff::Operation::Delete, L"\t"), Diff(Diff::Operation::Insert, std::wstring(L"\000", 1)));
  assertEquals(L"diff_main: Simple case #3.", diffs, dmp.diff_main(L"ax\t", std::wstring(L"\u0680x\000", 3), false));

  diffs = diffList(Diff(Diff::Operation::Delete, L"1"), Diff(Diff::Operation::Equal, L"a"), Diff(Diff::Operation::Delete, L"y"), Diff(Diff::Operation::Equal, L"b"), Diff(Diff::Operation::Delete, L"2"), Diff(Diff::Operation::Insert, L"xab"));
  assertEquals(L"diff_main: Overlap #1.", diffs, dmp.diff_main(L"1ayb2", L"abxab", false));

  diffs = diffList(Diff(Diff::Operation::Insert, L"xaxcx"), Diff(Diff::Operation::Equal, L"abc"), Diff(Diff::Operation::Delete, L"y"));
  assertEquals(L"diff_main: Overlap #2.", diffs, dmp.diff_main(L"abcy", L"xaxcxabc", false));

  diffs = diffList(Diff(Diff::Operation::Delete, L"ABCD"), Diff(Diff::Operation::Equal, L"a"), Diff(Diff::Operation::Delete, L"="), Diff(Diff::Operation::Insert, L"-"), Diff(Diff::Operation::Equal, L"bcd"), Diff(Diff::Operation::Delete, L"="), Diff(Diff::Operation::Insert, L"-"), Diff(Diff::Operation::Equal, L"efghijklmnopqrs"), Diff(Diff::Operation::Delete, L"EFGHIJKLMNOefg"));
  assertEquals(L"diff_main: Overlap #3.", diffs, dmp.diff_main(L"ABCDa=bcd=efghijklmnopqrsEFGHIJKLMNOefg", L"a-bcd-efghijklmnopqrs", false));

  diffs = diffList(Diff(Diff::Operation::Insert, L" "), Diff(Diff::Operation::Equal, L"a"), Diff(Diff::Operation::Insert, L"nd"), Diff(Diff::Operation::Equal, L" [[Pennsylvania]]"), Diff(Diff::Operation::Delete, L" and [[New"));
  assertEquals(L"diff_main: Large equality.", diffs, dmp.diff_main(L"a [[Pennsylvania]] and [[New", L" and [[Pennsylvania]]", false));

  dmp.Diff_Timeout = 0.1f;  // 100ms
  // This test may 'fail' on extremely fast computers.  If so, just increase the text lengths.
  std::wstring a = L"`Twas brillig, and the slithy toves\nDid gyre and gimble in the wabe:\nAll mimsy were the borogoves,\nAnd the mome raths outgrabe.\n";
  std::wstring b = L"I am the very model of a modern major general,\nI've information vegetable, animal, and mineral,\nI know the kings of England, and I quote the fights historical,\nFrom Marathon to Waterloo, in order categorical.\n";
  // Increase the text lengths by 1024 times to ensure a timeout.
  for (int x = 0; x < 10; x++) {
    a = a + a;
    b = b + b;
  }
  clock_t startTime = clock();
  dmp.diff_main(a, b);
  clock_t endTime = clock();
  // Test that we took at least the timeout period.
  assertTrue(L"diff_main: Timeout min.", dmp.Diff_Timeout * CLOCKS_PER_SEC <= endTime - startTime);
  // Test that we didn't take forever (be forgiving).
  // Theoretically this test could fail very occasionally if the
  // OS task swaps or locks up for a second at the wrong moment.
  // Java seems to overrun by ~80% (compared with 10% for other languages).
  // Therefore use an upper limit of 0.5s instead of 0.2s.
  assertTrue(L"diff_main: Timeout max.", dmp.Diff_Timeout * CLOCKS_PER_SEC * 2 > endTime - startTime);
  dmp.Diff_Timeout = 0;

  // Test the linemode speedup.
  // Must be long to pass the 100 char cutoff.
  a = L"1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n";
  b = L"abcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\nabcdefghij\n";
  assertEquals(L"diff_main: Simple line-mode.", dmp.diff_main(a, b, true), dmp.diff_main(a, b, false));

  a = L"1234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890";
  b = L"abcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghij";
  assertEquals(L"diff_main: Single line-mode.", dmp.diff_main(a, b, true), dmp.diff_main(a, b, false));

  a = L"1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n1234567890\n";
  b = L"abcdefghij\n1234567890\n1234567890\n1234567890\nabcdefghij\n1234567890\n1234567890\n1234567890\nabcdefghij\n1234567890\n1234567890\n1234567890\nabcdefghij\n";
  std::deque<std::wstring> texts_linemode = diff_rebuildtexts(dmp.diff_main(a, b, true));
  std::deque<std::wstring> texts_textmode = diff_rebuildtexts(dmp.diff_main(a, b, false));
  assertEquals(L"diff_main: Overlap line-mode.", texts_textmode, texts_linemode);
}